

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

Gia_Man_t * Gia_ManEquivReduce2(Gia_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  void *__s;
  Gia_Rpr_t *pGVar6;
  ulong uVar7;
  int *piVar8;
  Gia_Man_t *pGVar9;
  Vec_Int_t *vMap;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  size_t sVar17;
  
  pGVar6 = p->pReprs;
  if (pGVar6 == (Gia_Rpr_t *)0x0) {
    if (p->pSibls != (int *)0x0) {
      sVar17 = (size_t)p->nObjs;
      __s = malloc(sVar17 * 4);
      memset(__s,0xff,sVar17 * 4);
      pGVar6 = (Gia_Rpr_t *)calloc(sVar17,4);
      p->pReprs = pGVar6;
      if (0 < (long)sVar17) {
        lVar14 = 0;
        do {
          p->pReprs[lVar14] = (Gia_Rpr_t)((uint)p->pReprs[lVar14] | 0xfffffff);
          lVar14 = lVar14 + 1;
          iVar1 = p->nObjs;
          uVar7 = (ulong)iVar1;
        } while (lVar14 < (long)uVar7);
        if (0 < iVar1) {
          piVar8 = p->pSibls;
          uVar15 = 0;
          do {
            iVar13 = piVar8[uVar15];
            lVar14 = (long)iVar13;
            if (0 < lVar14) {
              iVar16 = *(int *)((long)__s + lVar14 * 4);
              if (iVar16 == -1) {
                *(int *)((long)__s + lVar14 * 4) = iVar13;
                iVar16 = iVar13;
              }
              *(int *)((long)__s + uVar15 * 4) = iVar16;
            }
            uVar15 = uVar15 + 1;
          } while (uVar7 != uVar15);
          if (0 < iVar1) {
            lVar14 = 0;
            do {
              if (0 < p->pSibls[lVar14]) {
                uVar5 = *(uint *)((long)__s + lVar14 * 4);
                if (lVar14 <= (int)uVar5 && (long)(int)uVar5 != 0xfffffff) {
                  __assert_fail("Num == GIA_VOID || Num < Id",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x400,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
                }
                p->pReprs[lVar14] =
                     (Gia_Rpr_t)((uint)p->pReprs[lVar14] & 0xf0000000 | uVar5 & 0xfffffff);
                uVar7 = (ulong)(uint)p->nObjs;
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < (int)uVar7);
          }
        }
      }
      if (p->pNexts != (int *)0x0) {
        free(p->pNexts);
        p->pNexts = (int *)0x0;
      }
      piVar8 = Gia_ManDeriveNexts(p);
      p->pNexts = piVar8;
      if (__s != (void *)0x0) {
        free(__s);
      }
    }
    pGVar6 = p->pReprs;
    if (pGVar6 == (Gia_Rpr_t *)0x0) {
      Abc_Print(1,"Gia_ManEquivReduce(): Equivalence classes are not available.\n");
      return (Gia_Man_t *)0x0;
    }
  }
  uVar5 = p->nObjs;
  if ((int)uVar5 < 1) {
    uVar7 = 0;
LAB_001fe183:
    if ((uint)uVar7 != uVar5) {
      vMap = Gia_ManChoiceMinLevel(p);
      Gia_ManSetPhase(p);
      pGVar9 = Gia_ManStart(p->nObjs);
      pcVar2 = p->pName;
      if (pcVar2 == (char *)0x0) {
        pcVar10 = (char *)0x0;
      }
      else {
        sVar17 = strlen(pcVar2);
        pcVar10 = (char *)malloc(sVar17 + 1);
        strcpy(pcVar10,pcVar2);
      }
      pGVar9->pName = pcVar10;
      pcVar2 = p->pSpec;
      if (pcVar2 == (char *)0x0) {
        pcVar10 = (char *)0x0;
      }
      else {
        sVar17 = strlen(pcVar2);
        pcVar10 = (char *)malloc(sVar17 + 1);
        strcpy(pcVar10,pcVar2);
      }
      pGVar9->pSpec = pcVar10;
      Gia_ManFillValue(p);
      p->pObjs->Value = 0;
      pVVar12 = p->vCis;
      if (0 < pVVar12->nSize) {
        lVar14 = 0;
        do {
          iVar1 = pVVar12->pArray[lVar14];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001fe47f;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          pGVar11 = Gia_ManAppendObj(pGVar9);
          uVar7 = *(ulong *)pGVar11;
          *(ulong *)pGVar11 = uVar7 | 0x9fffffff;
          *(ulong *)pGVar11 =
               uVar7 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(pGVar9->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = pGVar9->pObjs;
          if ((pGVar11 < pGVar4) || (pGVar4 + pGVar9->nObjs <= pGVar11)) {
LAB_001fe49e:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(pGVar9->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = pGVar9->pObjs;
          if ((pGVar11 < pGVar4) || (pGVar4 + pGVar9->nObjs <= pGVar11)) goto LAB_001fe49e;
          pGVar3[iVar1].Value = (int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * 0x55555556;
          lVar14 = lVar14 + 1;
          pVVar12 = p->vCis;
        } while (lVar14 < pVVar12->nSize);
      }
      Gia_ManHashAlloc(pGVar9);
      pVVar12 = p->vCos;
      uVar7 = (ulong)(uint)pVVar12->nSize;
      if (0 < pVVar12->nSize) {
        lVar14 = 0;
        do {
          iVar13 = (int)uVar7;
          iVar1 = pVVar12->pArray[lVar14];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001fe47f;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar1;
          Gia_ManEquivReduce2_rec
                    (pGVar9,p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff),vMap,1);
          lVar14 = lVar14 + 1;
          pVVar12 = p->vCos;
          iVar13 = pVVar12->nSize;
          uVar7 = (ulong)iVar13;
        } while (lVar14 < (long)uVar7);
        if (0 < iVar13) {
          lVar14 = 0;
          do {
            iVar1 = pVVar12->pArray[lVar14];
            if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_001fe47f:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            pGVar3 = p->pObjs + iVar1;
            if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            uVar5 = Gia_ManAppendCo(pGVar9,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                           pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)
                                                 ].Value);
            pGVar3->Value = uVar5;
            lVar14 = lVar14 + 1;
            pVVar12 = p->vCos;
          } while (lVar14 < pVVar12->nSize);
        }
      }
      Gia_ManHashStop(pGVar9);
      Gia_ManSetRegNum(pGVar9,p->nRegs);
      if (vMap->pArray != (int *)0x0) {
        free(vMap->pArray);
      }
      free(vMap);
      return pGVar9;
    }
  }
  else {
    uVar7 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_001fe183;
      if (((uint)pGVar6[uVar7] & 0xfffffff) != 0xfffffff) {
        if (((uint)pGVar6[uVar7] & 0xfffffff) < uVar5) goto LAB_001fe183;
        goto LAB_001fe47f;
      }
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  pGVar9 = Gia_ManDup(p);
  return pGVar9;
}

Assistant:

Gia_Man_t * Gia_ManEquivReduce2( Gia_Man_t * p )
{
    Vec_Int_t * vMap;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    if ( !p->pReprs && p->pSibls )
    {
        int * pMap = ABC_FALLOC( int, Gia_ManObjNum(p) );
        p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            Gia_ObjSetRepr( p, i, GIA_VOID );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( p->pSibls[i] > 0 )
            {
                if ( pMap[p->pSibls[i]] == -1 )
                    pMap[p->pSibls[i]] = p->pSibls[i];
                pMap[i] = pMap[p->pSibls[i]];
            }
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( p->pSibls[i] > 0 )
                Gia_ObjSetRepr( p, i, pMap[i] );
        //printf( "Created equivalence classes.\n" );
        ABC_FREE( p->pNexts );
        p->pNexts = Gia_ManDeriveNexts( p );
        ABC_FREE( pMap );
    }
    if ( !p->pReprs )
    {
        Abc_Print( 1, "Gia_ManEquivReduce(): Equivalence classes are not available.\n" );
        return NULL;
    }
    // check if there are any equivalences defined
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjReprObj(p, i) != NULL )
            break;
    if ( i == Gia_ManObjNum(p) )
        return Gia_ManDup( p );
    vMap = Gia_ManChoiceMinLevel( p );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManEquivReduce2_rec( pNew, p, Gia_ObjFanin0(pObj), vMap, 1 );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vMap );
    return pNew;
}